

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_DETECT_LIVING_MONSTERS(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  char *fmt;
  
  _Var1 = detect_monsters(context->y,context->x,monster_is_living);
  if (_Var1) {
    fmt = "You sense life!";
  }
  else {
    if (context->aware != true) goto LAB_0013f595;
    fmt = "You sense no life.";
  }
  msg(fmt);
LAB_0013f595:
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_DETECT_LIVING_MONSTERS(effect_handler_context_t *context)
{
	bool monsters = detect_monsters(context->y, context->x, monster_is_living);

	if (monsters)
		msg("You sense life!");
	else if (context->aware)
		msg("You sense no life.");

	context->ident = true;
	return true;
}